

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_swap_before_finish_test(bool run)

{
  Color CVar1;
  bool bVar2;
  Offset<MyGame::Example::Monster> root;
  SizeT SVar3;
  SizeT SVar4;
  string local_178;
  string local_158;
  offset_type local_138;
  offset_type local_134;
  SizeT local_130;
  Offset<MyGame::Example::Monster> local_12c;
  SizeT size2;
  Offset<MyGame::Example::Monster> root_offset2;
  TestHeapBuilder dst;
  SizeT size1;
  undefined1 local_90 [4];
  Offset<MyGame::Example::Monster> root_offset1;
  TestHeapBuilder src;
  bool run_local;
  
  if (run) {
    TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)local_90);
    root = populate1((FlatBufferBuilder *)local_90);
    SVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                      ((FlatBufferBuilderImpl<false> *)local_90);
    TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)&size2);
    local_12c = populate2((FlatBufferBuilder *)&size2);
    local_130 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                          ((FlatBufferBuilderImpl<false> *)&size2);
    flatbuffers::FlatBufferBuilderImpl<false>::Swap
              ((FlatBufferBuilderImpl<false> *)local_90,(FlatBufferBuilderImpl<false> *)&size2);
    local_134 = local_12c.o;
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              ((FlatBufferBuilderImpl<false> *)local_90,local_12c,(char *)0x0);
    local_138 = root.o;
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              ((FlatBufferBuilderImpl<false> *)&size2,root,(char *)0x0);
    SVar4 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                      ((FlatBufferBuilderImpl<false> *)local_90);
    TestEq<bool,bool>(local_130 < SVar4,true,"\'src.GetSize() > size2\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb1,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    SVar4 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                      ((FlatBufferBuilderImpl<false> *)&size2);
    TestEq<bool,bool>(SVar3 < SVar4,true,"\'dst.GetSize() > size1\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb2,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    m2_name_abi_cxx11_();
    CVar1 = m2_color();
    bVar2 = release_n_verify((FlatBufferBuilder *)local_90,&local_158,CVar1);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb3,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_158);
    m1_name_abi_cxx11_();
    CVar1 = m1_color();
    bVar2 = release_n_verify((FlatBufferBuilder *)&size2,&local_178,CVar1);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb4,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_178);
    TestHeapBuilder::~TestHeapBuilder((TestHeapBuilder *)&size2);
    TestHeapBuilder::~TestHeapBuilder((TestHeapBuilder *)local_90);
  }
  return;
}

Assistant:

static void builder_swap_before_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      src.Finish(root_offset2);
      dst.Finish(root_offset1);
      TEST_EQ_FUNC(src.GetSize() > size2, true);
      TEST_EQ_FUNC(dst.GetSize() > size1, true);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }